

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::internal::
MatcherBase<const_phmap::node_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>_&>
::~MatcherBase(MatcherBase<const_phmap::node_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>_&>
               *this)

{
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001dbac0;
  Destroy(this);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }